

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int local_10 [2];
  int a;
  
  local_10[1] = 0;
  local_10[0] = 0;
  while (local_10[0] == 0) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_689);
    std::istream::operator>>((istream *)&std::cin,local_10);
  }
  return 0;
}

Assistant:

int main() {
    int a = 0;

    while(0 == a) {
        cout << "Введите число (оно должно отличаться от 0) ";
        cin >> a;
    }

    return 0;
}